

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

RegExp * __thiscall re2c::Scanner::mkDefault(Scanner *this)

{
  opt_t *poVar1;
  ulong uVar2;
  Range *pRVar3;
  RegExp *pRVar4;
  uint32_t u;
  RegExp *local_18;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  uVar2 = (ulong)(poVar1->encoding).type_;
  u = 0x110000;
  if (uVar2 < 6) {
    u = *(uint32_t *)(&DAT_0014c374 + uVar2 * 4);
  }
  pRVar3 = Range::ran(0,u);
  pRVar4 = (RegExp *)operator_new(0x10);
  pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
  local_18 = pRVar4;
  std::
  _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
  ::_M_insert_unique<re2c::RegExp*>
            ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
              *)RegExp::vFreeList,&local_18);
  pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cbf0;
  pRVar4[1]._vptr_RegExp = (_func_int **)pRVar3;
  return pRVar4;
}

Assistant:

RegExp * Scanner::mkDefault() const
{
	Range * def = Range::ran (0, opts->encoding.nCodeUnits());
	return new MatchOp(def);
}